

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_predictor_32x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  long lVar16;
  undefined4 uVar17;
  undefined1 auVar18 [16];
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  
  lVar16 = 0;
  iVar19 = 0;
  iVar20 = 0;
  iVar21 = 0;
  iVar22 = 0;
  do {
    uVar2 = *(ulong *)(above + lVar16);
    auVar4._8_4_ = 0;
    auVar4._0_8_ = uVar2;
    auVar4._12_2_ = (short)(uVar2 >> 0x30);
    auVar7._8_2_ = (short)(uVar2 >> 0x20);
    auVar7._0_8_ = uVar2;
    auVar7._10_4_ = auVar4._10_4_;
    auVar13._6_8_ = 0;
    auVar13._0_6_ = auVar7._8_6_;
    auVar10._4_2_ = (short)(uVar2 >> 0x10);
    auVar10._0_4_ = (uint)uVar2;
    auVar10._6_8_ = SUB148(auVar13 << 0x40,6);
    iVar19 = iVar19 + ((uint)uVar2 & 0xffff);
    iVar20 = iVar20 + auVar10._4_4_;
    iVar21 = iVar21 + auVar7._8_4_;
    iVar22 = iVar22 + (auVar4._10_4_ >> 0x10);
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0x20);
  uVar2 = *(ulong *)left;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_2_ = (short)(uVar2 >> 0x30);
  auVar8._8_2_ = (short)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._10_4_ = auVar5._10_4_;
  auVar14._6_8_ = 0;
  auVar14._0_6_ = auVar8._8_6_;
  auVar11._4_2_ = (short)(uVar2 >> 0x10);
  auVar11._0_4_ = (uint)uVar2;
  auVar11._6_8_ = SUB148(auVar14 << 0x40,6);
  uVar3 = *(ulong *)(left + 4);
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar3;
  auVar6._12_2_ = (short)(uVar3 >> 0x30);
  auVar9._8_2_ = (short)(uVar3 >> 0x20);
  auVar9._0_8_ = uVar3;
  auVar9._10_4_ = auVar6._10_4_;
  auVar15._6_8_ = 0;
  auVar15._0_6_ = auVar9._8_6_;
  auVar12._4_2_ = (short)(uVar3 >> 0x10);
  auVar12._0_4_ = (uint)uVar3;
  auVar12._6_8_ = SUB148(auVar15 << 0x40,6);
  auVar18 = ZEXT416(((auVar6._10_4_ >> 0x10) + (auVar5._10_4_ >> 0x10) +
                     auVar12._4_4_ + auVar11._4_4_ +
                     auVar9._8_4_ + auVar8._8_4_ +
                     ((uint)uVar3 & 0xffff) + ((uint)uVar2 & 0xffff) +
                     iVar22 + iVar20 + iVar21 + iVar19 + 0x14 >> 3) * 0x6667 >> 0x11);
  auVar18 = pshuflw(auVar18,auVar18,0);
  uVar17 = auVar18._0_4_;
  iVar19 = 0;
  do {
    lVar16 = 0;
    do {
      puVar1 = dst + lVar16;
      *(undefined4 *)puVar1 = uVar17;
      *(undefined4 *)(puVar1 + 2) = uVar17;
      *(undefined4 *)(puVar1 + 4) = uVar17;
      *(undefined4 *)(puVar1 + 6) = uVar17;
      lVar16 = lVar16 + 8;
    } while (lVar16 != 0x20);
    iVar19 = iVar19 + 1;
    dst = dst + stride;
  } while (iVar19 != 8);
  return;
}

Assistant:

void aom_highbd_dc_predictor_32x8_c(uint16_t *dst, ptrdiff_t stride,
                                    const uint16_t *above, const uint16_t *left,
                                    int bd) {
  highbd_dc_predictor_rect(dst, stride, 32, 8, above, left, bd, 3,
                           HIGHBD_DC_MULTIPLIER_1X4);
}